

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::InterpretArgument
          (CommandLineInterface *this,string *name,string *value)

{
  _Rb_tree_header *p_Var1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  undefined8 uVar3;
  int iVar4;
  iterator iVar5;
  long lVar6;
  LogMessage *other;
  mapped_type *pmVar7;
  int version;
  long lVar8;
  size_type sVar9;
  ostream *poVar10;
  char *pcVar11;
  pointer pcVar12;
  char cVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar14;
  string *psVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  bool bVar16;
  string path;
  string disk_path;
  string plugin_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  undefined1 local_f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [32];
  _Alloc_hider local_98;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  CommandLineInterface *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (name->_M_string_length == 0) {
    if (value->_M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->input_files_,value);
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "You seem to have passed an empty string as one of the arguments to ",0x43);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(this->executable_name_)._M_dataplus._M_p,
                         (this->executable_name_)._M_string_length);
    pcVar11 = 
    ".  This is actually sort of hard to do.  Congrats.  Unfortunately it is not valid input so the program is going to die now."
    ;
    lVar8 = 0x7b;
LAB_00206ead:
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar11,lVar8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    return PARSE_ARGUMENT_FAIL;
  }
  iVar4 = std::__cxx11::string::compare((char *)name);
  if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)name), iVar4 == 0)) {
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50 = this;
    SplitStringUsing(value,":",&local_48);
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_50 = (CommandLineInterface *)&local_50->proto_path_;
      lVar8 = 0;
      uVar14 = 0;
      do {
        local_f8._0_8_ = local_f8 + 0x10;
        local_f8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_f8._16_8_ = local_f8._16_8_ & 0xffffffffffffff00;
        local_d8._M_allocated_capacity = (size_type)&local_c8;
        local_d8._8_8_ = 0;
        local_c8._M_local_buf[0] = '\0';
        lVar6 = std::__cxx11::string::find
                          ((char)local_48.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (char)lVar8,0x3d);
        if (lVar6 == -1) {
          std::__cxx11::string::_M_replace((ulong)local_f8,0,(char *)local_f8._8_8_,0x352e62);
          std::__cxx11::string::_M_assign((string *)local_d8._M_local_buf);
        }
        else {
          std::__cxx11::string::substr
                    ((ulong)local_b8,
                     (long)&((local_48.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8)
          ;
          std::__cxx11::string::operator=((string *)local_f8,(string *)local_b8);
          if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
            operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
          }
          std::__cxx11::string::substr
                    ((ulong)local_b8,
                     (long)&((local_48.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8)
          ;
          std::__cxx11::string::operator=((string *)local_d8._M_local_buf,(string *)local_b8);
          if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
            operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
          }
        }
        uVar3 = local_d8._8_8_;
        if (local_d8._8_8_ == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "--proto_path passed empty directory name.  (Use \".\" for current directory.)"
                     ,0x4b);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
          std::ostream::put(-0x40);
          std::ostream::flush();
        }
        else {
          iVar4 = access((char *)local_d8._M_allocated_capacity,0);
          if (iVar4 < 0) {
            iVar4 = access(*(char **)((long)&((local_48.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar8),0);
            if (iVar4 < 0) {
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,(char *)local_d8._M_allocated_capacity,
                                   local_d8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,": warning: directory does not exist.",0x24);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
            }
            else {
              std::__cxx11::string::_M_replace((ulong)local_f8,0,(char *)local_f8._8_8_,0x352e62);
              std::__cxx11::string::_M_assign((string *)local_d8._M_local_buf);
            }
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8)
          ;
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)local_50,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_b8);
          if (local_98._M_p != local_90 + 8) {
            operator_delete(local_98._M_p,local_90._8_8_ + 1);
          }
          if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
            operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_allocated_capacity != &local_c8) {
          operator_delete((void *)local_d8._M_allocated_capacity,
                          CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) +
                          1);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_f8 + 0x10))
        {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
        if (uVar3 == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          return PARSE_ARGUMENT_FAIL;
        }
        uVar14 = uVar14 + 1;
        lVar8 = lVar8 + 0x20;
      } while (uVar14 < (ulong)((long)local_48.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_48.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    this_00 = &local_48;
LAB_00206e07:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_00);
    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
  }
  iVar4 = std::__cxx11::string::compare((char *)name);
  if (iVar4 == 0) {
    if (this->direct_dependencies_explicitly_set_ == true) {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
      pcVar11 = 
      " may only be passed once. To specify multiple direct dependencies, pass them all as a single parameter separated by \':\'."
      ;
      lVar8 = 0x78;
      goto LAB_00206ead;
    }
    this->direct_dependencies_explicitly_set_ = true;
    local_f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_f8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_f8._16_8_ = (pointer)0x0;
    SplitStringUsing(value,":",
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_f8);
    if ((this->direct_dependencies_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0x4e2);
      other = internal::LogMessage::operator<<
                        ((LogMessage *)local_b8,"CHECK failed: direct_dependencies_.empty(): ");
      internal::LogFinisher::operator=((LogFinisher *)local_d8._M_local_buf,other);
      internal::LogMessage::~LogMessage((LogMessage *)local_b8);
    }
    uVar3 = local_f8._8_8_;
    psVar2 = &this->direct_dependencies_;
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f8;
    local_b8._0_8_ = psVar2;
    if (local_f8._0_8_ != local_f8._8_8_) {
      __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._0_8_;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)psVar2,
                   (const_iterator)&(this->direct_dependencies_)._M_t._M_impl.super__Rb_tree_header,
                   __v,(_Alloc_node *)local_b8);
        __v = __v + 1;
        this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_f8;
      } while (__v != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar3);
    }
    goto LAB_00206e07;
  }
  iVar4 = std::__cxx11::string::compare((char *)name);
  if (iVar4 == 0) {
    psVar15 = (string *)&this->direct_dependencies_violation_msg_;
    goto LAB_00206f2c;
  }
  iVar4 = std::__cxx11::string::compare((char *)name);
  if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)name), iVar4 == 0)) {
    if ((this->descriptor_set_name_)._M_string_length == 0) {
      if (value->_M_string_length != 0) {
        if (this->mode_ == MODE_COMPILE) {
          psVar15 = (string *)&this->descriptor_set_name_;
          goto LAB_00206f2c;
        }
        poVar10 = (ostream *)&std::cerr;
        pcVar11 = "Cannot use --encode or --decode and generate descriptors at the same time.";
        lVar8 = 0x4a;
        goto LAB_00206f11;
      }
LAB_0020705b:
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
      pcVar11 = " requires a non-empty value.";
      lVar8 = 0x1c;
      goto LAB_00206f11;
    }
LAB_00206eec:
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
    pcVar11 = " may only be passed once.";
    lVar8 = 0x19;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)name);
    if (iVar4 == 0) {
      if ((this->dependency_out_name_)._M_string_length == 0) {
        if (value->_M_string_length != 0) {
          psVar15 = (string *)&this->dependency_out_name_;
          goto LAB_00206f2c;
        }
        goto LAB_0020705b;
      }
      goto LAB_00206eec;
    }
    iVar4 = std::__cxx11::string::compare((char *)name);
    if (iVar4 == 0) {
      if (this->imports_in_descriptor_set_ != true) {
        this->imports_in_descriptor_set_ = true;
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      goto LAB_00206eec;
    }
    iVar4 = std::__cxx11::string::compare((char *)name);
    if (iVar4 == 0) {
      if (this->source_info_in_descriptor_set_ != true) {
        this->source_info_in_descriptor_set_ = true;
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      goto LAB_00206eec;
    }
    iVar4 = std::__cxx11::string::compare((char *)name);
    if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)name), iVar4 == 0)) {
      PrintHelpText(this);
      return PARSE_ARGUMENT_DONE_AND_EXIT;
    }
    iVar4 = std::__cxx11::string::compare((char *)name);
    if (iVar4 == 0) {
      sVar9 = (this->version_info_)._M_string_length;
      if (sVar9 != 0) {
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(this->version_info_)._M_dataplus._M_p,sVar9);
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"libprotoc ",10);
      internal::VersionString_abi_cxx11_((string *)local_b8,(internal *)0x2dd278,version);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_b8._0_8_,local_b8._8_8_);
      std::endl<char,std::char_traits<char>>(poVar10);
      if ((undefined1 *)local_b8._0_8_ == local_b8 + 0x10) {
        return PARSE_ARGUMENT_DONE_AND_EXIT;
      }
      operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
      return PARSE_ARGUMENT_DONE_AND_EXIT;
    }
    iVar4 = std::__cxx11::string::compare((char *)name);
    if (iVar4 == 0) {
      this->disallow_services_ = true;
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    iVar4 = std::__cxx11::string::compare((char *)name);
    if (((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)name), iVar4 != 0)) &&
       (iVar4 = std::__cxx11::string::compare((char *)name), iVar4 != 0)) {
      iVar4 = std::__cxx11::string::compare((char *)name);
      if (iVar4 == 0) {
        iVar4 = std::__cxx11::string::compare((char *)value);
        if (iVar4 == 0) {
          this->error_format_ = ERROR_FORMAT_GCC;
          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
        }
        iVar4 = std::__cxx11::string::compare((char *)value);
        if (iVar4 == 0) {
          this->error_format_ = ERROR_FORMAT_MSVS;
          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown error format: ",0x16);
        pcVar12 = (value->_M_dataplus)._M_p;
        sVar9 = value->_M_string_length;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)name);
        cVar13 = (char)value;
        if (iVar4 == 0) {
          if ((this->plugin_prefix_)._M_string_length != 0) {
            local_b8._8_8_ = (char *)0x0;
            local_b8[0x10] = '\0';
            local_f8._8_8_ = (pointer)0x0;
            local_f8._16_8_ = local_f8._16_8_ & 0xffffffffffffff00;
            local_f8._0_8_ = (pointer)(local_f8 + 0x10);
            local_b8._0_8_ = local_b8 + 0x10;
            lVar8 = std::__cxx11::string::find(cVar13,0x3d);
            if (lVar8 == -1) {
              lVar8 = std::__cxx11::string::rfind(cVar13,0x2f);
              if (lVar8 == -1) {
                std::__cxx11::string::_M_assign((string *)local_b8);
              }
              else {
                std::__cxx11::string::substr((ulong)&local_d8,(ulong)value);
                std::__cxx11::string::operator=((string *)local_b8,(string *)local_d8._M_local_buf);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_allocated_capacity != &local_c8) {
                  operator_delete((void *)local_d8._M_allocated_capacity,
                                  CONCAT71(local_c8._M_allocated_capacity._1_7_,
                                           local_c8._M_local_buf[0]) + 1);
                }
              }
              std::__cxx11::string::_M_assign((string *)local_f8);
            }
            else {
              std::__cxx11::string::substr((ulong)&local_d8,(ulong)value);
              std::__cxx11::string::operator=((string *)local_b8,(string *)local_d8._M_local_buf);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_allocated_capacity != &local_c8) {
                operator_delete((void *)local_d8._M_allocated_capacity,
                                CONCAT71(local_c8._M_allocated_capacity._1_7_,
                                         local_c8._M_local_buf[0]) + 1);
              }
              std::__cxx11::string::substr((ulong)&local_d8,(ulong)value);
              std::__cxx11::string::operator=((string *)local_f8,(string *)local_d8._M_local_buf);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_allocated_capacity != &local_c8) {
                operator_delete((void *)local_d8._M_allocated_capacity,
                                CONCAT71(local_c8._M_allocated_capacity._1_7_,
                                         local_c8._M_local_buf[0]) + 1);
              }
            }
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&this->plugins_,(key_type *)local_b8);
            std::__cxx11::string::_M_assign((string *)pmVar7);
            if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
              operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
            }
            if ((undefined1 *)local_b8._0_8_ == local_b8 + 0x10) {
              return PARSE_ARGUMENT_DONE_AND_CONTINUE;
            }
            operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
            return PARSE_ARGUMENT_DONE_AND_CONTINUE;
          }
          pcVar11 = "This compiler does not support plugins.";
LAB_0020747a:
          poVar10 = (ostream *)&std::cerr;
          lVar8 = 0x27;
          goto LAB_00206f11;
        }
        iVar4 = std::__cxx11::string::compare((char *)name);
        if (iVar4 == 0) {
          if (this->mode_ == MODE_COMPILE) {
            if (((this->output_directives_).
                 super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 (this->output_directives_).
                 super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
               ((this->descriptor_set_name_)._M_string_length == 0)) {
              this->mode_ = MODE_PRINT;
              this->print_mode_ = PRINT_FREE_FIELDS;
              return PARSE_ARGUMENT_DONE_AND_CONTINUE;
            }
            goto LAB_00207617;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Cannot use ",0xb);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length
                              );
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," and use --encode, --decode or print ",0x25);
          pcVar11 = "other info at the same time.";
          lVar8 = 0x1c;
          goto LAB_00206f11;
        }
        iVar4 = std::__cxx11::string::compare((char *)name);
        if (iVar4 == 0) {
          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
        }
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>
                ::find(&(this->generators_by_flag_name_)._M_t,name);
        p_Var1 = &(this->generators_by_flag_name_)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
LAB_00206ab3:
          if (this->mode_ == MODE_COMPILE) {
            local_b8._0_8_ = local_b8 + 0x10;
            local_b8._8_8_ = (char *)0x0;
            local_b8[0x10] = '\0';
            local_90._0_8_ = &local_80;
            local_90._8_8_ = 0;
            local_80._M_local_buf[0] = '\0';
            local_70._M_p = (pointer)&local_60;
            local_68 = 0;
            local_60._M_local_buf[0] = '\0';
            std::__cxx11::string::_M_assign((string *)local_b8);
            if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
              local_98._M_p = (pointer)0x0;
            }
            else {
              local_98._M_p = *(pointer *)(iVar5._M_node + 4);
            }
            lVar8 = std::__cxx11::string::find(cVar13,0x3a);
            if (lVar8 == -1) {
              std::__cxx11::string::_M_assign((string *)&local_70);
            }
            else {
              std::__cxx11::string::substr((ulong)local_f8,(ulong)value);
              std::__cxx11::string::operator=((string *)local_90,(string *)local_f8);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_f8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_f8 + 0x10)) {
                operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
              }
              std::__cxx11::string::substr((ulong)local_f8,(ulong)value);
              std::__cxx11::string::operator=((string *)&local_70,(string *)local_f8);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_f8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_f8 + 0x10)) {
                operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
              }
            }
            std::
            vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
            ::push_back(&this->output_directives_,(value_type *)local_b8);
            OutputDirective::~OutputDirective((OutputDirective *)local_b8);
            return PARSE_ARGUMENT_DONE_AND_CONTINUE;
          }
          poVar10 = (ostream *)&std::cerr;
          pcVar11 = 
          "Cannot use --encode, --decode or print .proto info and generate code at the same time.";
          lVar8 = 0x56;
          goto LAB_00206f11;
        }
        if ((this->plugin_prefix_)._M_string_length != 0) {
          local_b8._0_8_ = local_b8 + 0x10;
          local_50 = this;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"_out","");
          bVar16 = true;
          if ((ulong)local_b8._8_8_ <= (string *)name->_M_string_length) {
            iVar4 = std::__cxx11::string::compare
                              ((ulong)name,(long)name->_M_string_length - local_b8._8_8_,
                               (string *)local_b8._8_8_);
            bVar16 = iVar4 != 0;
          }
          if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
            operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
          }
          this = local_50;
          if (!bVar16) goto LAB_00206ab3;
        }
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>
                ::find(&(this->generators_by_option_name_)._M_t,name);
        if ((_Rb_tree_header *)iVar5._M_node !=
            &(this->generators_by_option_name_)._M_t._M_impl.super__Rb_tree_header) {
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->generator_parameters_,(key_type *)(iVar5._M_node + 2));
          if (pmVar7->_M_string_length != 0) {
            std::__cxx11::string::append((char *)pmVar7);
          }
          std::__cxx11::string::_M_append((char *)pmVar7,(ulong)(value->_M_dataplus)._M_p);
          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
        }
        psVar2 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_b8 + 0x10);
        local_b8._0_8_ = psVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"--","");
        if (((string *)name->_M_string_length < (ulong)local_b8._8_8_) ||
           (iVar4 = std::__cxx11::string::compare((ulong)name,0,(string *)local_b8._8_8_),
           iVar4 != 0)) {
          bVar16 = false;
        }
        else {
          local_f8._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_f8 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"_opt","");
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              name->_M_string_length < (ulong)local_f8._8_8_) {
            bVar16 = false;
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((ulong)name,(long)name->_M_string_length - local_f8._8_8_,
                               (string *)local_f8._8_8_);
            bVar16 = iVar4 == 0;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._0_8_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_f8 + 0x10)
             ) {
            operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
          }
        }
        if ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b8._0_8_ != psVar2) {
          operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
        }
        if (bVar16) {
          anon_unknown_0::PluginName
                    ((string *)local_b8,(anon_unknown_0 *)(this->plugin_prefix_)._M_dataplus._M_p,
                     (string *)(this->plugin_prefix_)._M_string_length,name);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->plugin_parameters_,(string *)local_b8);
          if ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8._0_8_ != psVar2) {
            operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
          }
          if (pmVar7->_M_string_length != 0) {
            std::__cxx11::string::append((char *)pmVar7);
          }
          std::__cxx11::string::_M_append((char *)pmVar7,(ulong)(value->_M_dataplus)._M_p);
          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown flag: ",0xe);
        pcVar12 = (name->_M_dataplus)._M_p;
        sVar9 = name->_M_string_length;
      }
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar12,sVar9);
      goto LAB_00206f19;
    }
    if (this->mode_ == MODE_COMPILE) {
      if (((this->output_directives_).
           super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (this->output_directives_).
           super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         ((this->descriptor_set_name_)._M_string_length == 0)) {
        iVar4 = std::__cxx11::string::compare((char *)name);
        this->mode_ = MODE_DECODE - (iVar4 == 0);
        if (value->_M_string_length == 0) {
          iVar4 = std::__cxx11::string::compare((char *)name);
          if (iVar4 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Type name for ",0xe);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,
                                 name->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," cannot be blank.",0x11);
            std::endl<char,std::char_traits<char>>(poVar10);
            iVar4 = std::__cxx11::string::compare((char *)name);
            if (iVar4 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"To decode an unknown message, use --decode_raw.",
                         0x2f);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
              return PARSE_ARGUMENT_FAIL;
            }
            return PARSE_ARGUMENT_FAIL;
          }
          if (value->_M_string_length != 0) goto LAB_002071dc;
        }
        else {
LAB_002071dc:
          iVar4 = std::__cxx11::string::compare((char *)name);
          if (iVar4 == 0) {
            pcVar11 = "--decode_raw does not take a parameter.";
            goto LAB_0020747a;
          }
        }
        psVar15 = (string *)&this->codec_type_;
LAB_00206f2c:
        std::__cxx11::string::_M_assign(psVar15);
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
LAB_00207617:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Cannot use ",0xb);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
      pcVar11 = " and generate code or descriptors at the same time.";
      lVar8 = 0x33;
    }
    else {
      poVar10 = (ostream *)&std::cerr;
      pcVar11 = "Only one of --encode and --decode can be specified.";
      lVar8 = 0x33;
    }
  }
LAB_00206f11:
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar11,lVar8);
LAB_00206f19:
  std::endl<char,std::char_traits<char>>(poVar10);
  return PARSE_ARGUMENT_FAIL;
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::InterpretArgument(const string& name,
                                        const string& value) {
  if (name.empty()) {
    // Not a flag.  Just a filename.
    if (value.empty()) {
      std::cerr
          << "You seem to have passed an empty string as one of the "
             "arguments to " << executable_name_
          << ".  This is actually "
             "sort of hard to do.  Congrats.  Unfortunately it is not valid "
             "input so the program is going to die now." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    input_files_.push_back(value);

  } else if (name == "-I" || name == "--proto_path") {
    // Java's -classpath (and some other languages) delimits path components
    // with colons.  Let's accept that syntax too just to make things more
    // intuitive.
    std::vector<string> parts = Split(
        value, kPathSeparator, true);

    for (int i = 0; i < parts.size(); i++) {
      string virtual_path;
      string disk_path;

      string::size_type equals_pos = parts[i].find_first_of('=');
      if (equals_pos == string::npos) {
        virtual_path = "";
        disk_path = parts[i];
      } else {
        virtual_path = parts[i].substr(0, equals_pos);
        disk_path = parts[i].substr(equals_pos + 1);
      }

      if (disk_path.empty()) {
        std::cerr
            << "--proto_path passed empty directory name.  (Use \".\" for "
               "current directory.)" << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      // Make sure disk path exists, warn otherwise.
      if (access(disk_path.c_str(), F_OK) < 0) {
        // Try the original path; it may have just happed to have a '=' in it.
        if (access(parts[i].c_str(), F_OK) < 0) {
          std::cerr << disk_path << ": warning: directory does not exist."
                    << std::endl;
        } else {
          virtual_path = "";
          disk_path = parts[i];
        }
      }

      // Don't use make_pair as the old/default standard library on Solaris
      // doesn't support it without explicit template parameters, which are
      // incompatible with C++0x's make_pair.
      proto_path_.push_back(std::pair<string, string>(virtual_path, disk_path));
    }

  } else if (name == "--direct_dependencies") {
    if (direct_dependencies_explicitly_set_) {
      std::cerr << name << " may only be passed once. To specify multiple "
                           "direct dependencies, pass them all as a single "
                           "parameter separated by ':'."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    direct_dependencies_explicitly_set_ = true;
    std::vector<string> direct = Split(
        value, ":", true);
    GOOGLE_DCHECK(direct_dependencies_.empty());
    direct_dependencies_.insert(direct.begin(), direct.end());

  } else if (name == "--direct_dependencies_violation_msg") {
    direct_dependencies_violation_msg_ = value;

  } else if (name == "-o" || name == "--descriptor_set_out") {
    if (!descriptor_set_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (mode_ != MODE_COMPILE) {
      std::cerr
          << "Cannot use --encode or --decode and generate descriptors at the "
             "same time." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    descriptor_set_name_ = value;

  } else if (name == "--dependency_out") {
    if (!dependency_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    dependency_out_name_ = value;

  } else if (name == "--include_imports") {
    if (imports_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    imports_in_descriptor_set_ = true;

  } else if (name == "--include_source_info") {
    if (source_info_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    source_info_in_descriptor_set_ = true;

  } else if (name == "-h" || name == "--help") {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--version") {
    if (!version_info_.empty()) {
      std::cout << version_info_ << std::endl;
    }
    cout << "libprotoc "
         << protobuf::internal::VersionString(GOOGLE_PROTOBUF_VERSION)
         << endl;
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--disallow_services") {
    disallow_services_ = true;

  } else if (name == "--encode" || name == "--decode" ||
             name == "--decode_raw") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Only one of --encode and --decode can be specified."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    mode_ = (name == "--encode") ? MODE_ENCODE : MODE_DECODE;

    if (value.empty() && name != "--decode_raw") {
      std::cerr << "Type name for " << name << " cannot be blank." << std::endl;
      if (name == "--decode") {
        std::cerr << "To decode an unknown message, use --decode_raw."
                  << std::endl;
      }
      return PARSE_ARGUMENT_FAIL;
    } else if (!value.empty() && name == "--decode_raw") {
      std::cerr << "--decode_raw does not take a parameter." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    codec_type_ = value;

  } else if (name == "--error_format") {
    if (value == "gcc") {
      error_format_ = ERROR_FORMAT_GCC;
    } else if (value == "msvs") {
      error_format_ = ERROR_FORMAT_MSVS;
    } else {
      std::cerr << "Unknown error format: " << value << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

  } else if (name == "--plugin") {
    if (plugin_prefix_.empty()) {
      std::cerr << "This compiler does not support plugins." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    string plugin_name;
    string path;

    string::size_type equals_pos = value.find_first_of('=');
    if (equals_pos == string::npos) {
      // Use the basename of the file.
      string::size_type slash_pos = value.find_last_of('/');
      if (slash_pos == string::npos) {
        plugin_name = value;
      } else {
        plugin_name = value.substr(slash_pos + 1);
      }
      path = value;
    } else {
      plugin_name = value.substr(0, equals_pos);
      path = value.substr(equals_pos + 1);
    }

    plugins_[plugin_name] = path;

  } else if (name == "--print_free_field_numbers") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Cannot use " << name
                << " and use --encode, --decode or print "
                << "other info at the same time." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    mode_ = MODE_PRINT;
    print_mode_ = PRINT_FREE_FIELDS;
  } else if (name == "--profile_path") {
  } else {
    // Some other flag.  Look it up in the generators list.
    const GeneratorInfo* generator_info =
        FindOrNull(generators_by_flag_name_, name);
    if (generator_info == NULL &&
        (plugin_prefix_.empty() || !HasSuffixString(name, "_out"))) {
      // Check if it's a generator option flag.
      generator_info = FindOrNull(generators_by_option_name_, name);
      if (generator_info != NULL) {
        string* parameters = &generator_parameters_[generator_info->flag_name];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else if (HasPrefixString(name, "--") && HasSuffixString(name, "_opt")) {
        string* parameters =
            &plugin_parameters_[PluginName(plugin_prefix_, name)];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else {
        std::cerr << "Unknown flag: " << name << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
    } else {
      // It's an output flag.  Add it to the output directives.
      if (mode_ != MODE_COMPILE) {
        std::cerr << "Cannot use --encode, --decode or print .proto info and "
                     "generate code at the same time." << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      OutputDirective directive;
      directive.name = name;
      if (generator_info == NULL) {
        directive.generator = NULL;
      } else {
        directive.generator = generator_info->generator;
      }

      // Split value at ':' to separate the generator parameter from the
      // filename.  However, avoid doing this if the colon is part of a valid
      // Windows-style absolute path.
      string::size_type colon_pos = value.find_first_of(':');
      if (colon_pos == string::npos || IsWindowsAbsolutePath(value)) {
        directive.output_location = value;
      } else {
        directive.parameter = value.substr(0, colon_pos);
        directive.output_location = value.substr(colon_pos + 1);
      }

      output_directives_.push_back(directive);
    }
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}